

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::ApplyTransform
          (PretransformVertices *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  aiVector3D *paVar6;
  uint uVar7;
  uint i_2;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  fVar18 = mat->a2;
  if ((((((0.01 < ABS(fVar18)) || (0.01 < ABS(mat->a3))) || (0.01 < ABS(mat->a4))) ||
       ((0.01 < ABS(mat->b1) || (0.01 < ABS(mat->b3))))) ||
      (((0.01 < ABS(mat->b4) || ((0.01 < ABS(mat->c1) || (0.01 < ABS(mat->c2))))) ||
       (0.01 < ABS(mat->c4))))) ||
     ((((((0.01 < ABS(mat->d1) || (0.01 < ABS(mat->d2))) || (0.01 < ABS(mat->d3))) ||
        (((1.01 < mat->a1 || (mat->a1 < 0.99)) ||
         ((1.01 < mat->b2 || ((mat->b2 < 0.99 || (1.01 < mat->c3)))))))) || (mat->c3 < 0.99)) ||
      ((1.01 < mat->d4 || (mat->d4 < 0.99)))))) {
    if ((mesh->mFaces != (aiFace *)0x0) && (mesh->mNumFaces != 0)) {
      fVar12 = mat->b2;
      fVar20 = mat->a1;
      fVar1 = mat->a3;
      fVar16 = mat->c3;
      fVar17 = mat->d4;
      fVar22 = mat->c4;
      fVar19 = mat->d3;
      fVar21 = mat->b3;
      fVar11 = mat->d2;
      fVar13 = mat->c2;
      fVar14 = mat->b4;
      fVar23 = mat->d1;
      fVar15 = mat->c1;
      fVar2 = mat->b1;
      fVar3 = mat->a4;
      if (fVar21 * fVar3 * fVar13 * fVar23 +
          ((fVar12 * fVar3 * fVar15 * fVar19 +
           ((fVar2 * fVar3 * fVar16 * fVar11 +
            (((fVar22 * fVar1 * fVar12 * fVar23 +
              ((fVar13 * fVar2 * fVar1 * fVar17 +
               ((fVar15 * fVar14 * fVar1 * fVar11 +
                fVar18 * fVar2 * fVar22 * fVar19 +
                ((fVar18 * fVar14 * fVar16 * fVar23 +
                 ((fVar18 * fVar21 * fVar15 * fVar17 +
                  (((fVar13 * fVar20 * fVar14 * fVar19 +
                    ((fVar22 * fVar20 * fVar21 * fVar11 +
                     (fVar20 * fVar12 * fVar16 * fVar17 - fVar22 * fVar20 * fVar12 * fVar19)) -
                    fVar20 * fVar21 * fVar13 * fVar17)) - fVar20 * fVar14 * fVar16 * fVar11) -
                  fVar22 * fVar18 * fVar21 * fVar23)) - fVar15 * fVar18 * fVar14 * fVar19)) -
                fVar16 * fVar18 * fVar2 * fVar17)) - fVar14 * fVar1 * fVar13 * fVar23)) -
              fVar2 * fVar1 * fVar22 * fVar11)) - fVar1 * fVar12 * fVar15 * fVar17) -
            fVar13 * fVar2 * fVar3 * fVar19)) - fVar16 * fVar12 * fVar3 * fVar23)) -
          fVar15 * fVar21 * fVar3 * fVar11) < 0.0) {
        FlipWindingOrderProcess::ProcessMesh(mesh);
      }
    }
    uVar7 = mesh->mNumVertices;
    if (uVar7 != 0 && mesh->mVertices != (aiVector3D *)0x0) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        paVar6 = mesh->mVertices;
        fVar18 = *(float *)((long)paVar6 + lVar8 + -8);
        fVar12 = *(float *)((long)paVar6 + lVar8 + -4);
        fVar20 = *(float *)((long)&paVar6->x + lVar8);
        fVar1 = mat->c2;
        fVar16 = mat->c1;
        fVar17 = mat->c3;
        fVar22 = mat->c4;
        *(ulong *)((long)paVar6 + lVar8 + -8) =
             CONCAT44(mat->b4 + fVar20 * mat->b3 + fVar18 * mat->b1 + mat->b2 * fVar12,
                      mat->a4 + fVar20 * mat->a3 + fVar18 * mat->a1 + mat->a2 * fVar12);
        *(float *)((long)&paVar6->x + lVar8) =
             fVar20 * fVar17 + fVar18 * fVar16 + fVar12 * fVar1 + fVar22;
        uVar9 = uVar9 + 1;
        uVar7 = mesh->mNumVertices;
        lVar8 = lVar8 + 0xc;
      } while (uVar9 < uVar7);
    }
    bVar10 = mesh->mNormals != (aiVector3D *)0x0;
    if ((uVar7 != 0 && bVar10) ||
       ((mesh->mBitangents != (aiVector3D *)0x0 && mesh->mTangents != (aiVector3D *)0x0) &&
        uVar7 != 0)) {
      fVar18 = mat->a1;
      fVar12 = mat->a2;
      fVar20 = mat->b1;
      uVar4 = mat->b2;
      uVar5 = mat->b3;
      fVar1 = mat->c1;
      fVar16 = mat->c2;
      fVar17 = mat->c3;
      fVar19 = fVar20 * -fVar12;
      fVar21 = -mat->a3;
      fVar22 = (float)uVar4 * fVar21 * fVar1 +
               mat->a3 * fVar20 * fVar16 +
               fVar19 * fVar17 +
               fVar12 * (float)uVar5 * fVar1 +
               (fVar18 * (float)uVar4 * fVar17 - (float)uVar5 * fVar18 * fVar16);
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        fVar22 = 1.0 / fVar22;
        fVar23 = -fVar22;
        fVar15 = ((float)uVar5 * fVar12 + (float)uVar4 * fVar21) * fVar22;
        fVar13 = ((float)uVar4 * fVar17 + fVar16 * -(float)uVar5) * fVar22;
        fVar14 = (fVar12 * fVar17 + fVar16 * fVar21) * fVar23;
        fVar11 = (fVar20 * fVar16 + -(float)uVar4 * fVar1) * fVar22;
        fVar12 = (fVar18 * fVar16 + -fVar12 * fVar1) * fVar23;
        fVar16 = (fVar18 * (float)uVar4 + fVar19) * fVar22;
        fVar19 = (fVar18 * (float)uVar5 + fVar21 * fVar20) * fVar23;
        fVar23 = fVar23 * (fVar17 * fVar20 + -(float)uVar5 * fVar1);
        fVar22 = fVar22 * (fVar17 * fVar18 + fVar21 * fVar1);
      }
      else {
        fVar11 = NAN;
        fVar12 = NAN;
        fVar15 = NAN;
        fVar13 = fVar11;
        fVar14 = fVar12;
        fVar16 = fVar11;
        fVar19 = fVar12;
        fVar23 = fVar11;
        fVar22 = fVar12;
      }
      if (uVar7 != 0 && bVar10) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          paVar6 = mesh->mNormals;
          fVar18 = *(float *)((long)paVar6 + lVar8 + -8);
          fVar20 = *(float *)((long)paVar6 + lVar8 + -4);
          fVar1 = *(float *)((long)&paVar6->x + lVar8);
          fVar21 = fVar16 * fVar1 + fVar15 * fVar18 + fVar19 * fVar20;
          fVar17 = fVar1 * fVar11 + fVar18 * fVar13 + fVar20 * fVar23;
          fVar18 = fVar1 * fVar12 + fVar18 * fVar14 + fVar20 * fVar22;
          fVar20 = 1.0 / SQRT(fVar21 * fVar21 + fVar17 * fVar17 + fVar18 * fVar18);
          *(ulong *)((long)paVar6 + lVar8 + -8) = CONCAT44(fVar20 * fVar18,fVar20 * fVar17);
          *(float *)((long)&paVar6->x + lVar8) = fVar21 * fVar20;
          uVar9 = uVar9 + 1;
          uVar7 = mesh->mNumVertices;
          lVar8 = lVar8 + 0xc;
        } while (uVar9 < uVar7);
      }
      if (uVar7 != 0 &&
          (mesh->mBitangents != (aiVector3D *)0x0 && mesh->mTangents != (aiVector3D *)0x0)) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          paVar6 = mesh->mTangents;
          fVar18 = *(float *)((long)paVar6 + lVar8 + -8);
          fVar20 = *(float *)((long)paVar6 + lVar8 + -4);
          fVar1 = *(float *)((long)&paVar6->x + lVar8);
          fVar21 = fVar16 * fVar1 + fVar15 * fVar18 + fVar19 * fVar20;
          fVar17 = fVar1 * fVar11 + fVar18 * fVar13 + fVar20 * fVar23;
          fVar18 = fVar1 * fVar12 + fVar18 * fVar14 + fVar20 * fVar22;
          fVar20 = 1.0 / SQRT(fVar21 * fVar21 + fVar17 * fVar17 + fVar18 * fVar18);
          *(ulong *)((long)paVar6 + lVar8 + -8) = CONCAT44(fVar20 * fVar18,fVar20 * fVar17);
          *(float *)((long)&paVar6->x + lVar8) = fVar21 * fVar20;
          paVar6 = mesh->mBitangents;
          fVar18 = *(float *)((long)paVar6 + lVar8 + -8);
          fVar20 = *(float *)((long)paVar6 + lVar8 + -4);
          fVar1 = *(float *)((long)&paVar6->x + lVar8);
          fVar21 = fVar16 * fVar1 + fVar15 * fVar18 + fVar19 * fVar20;
          fVar17 = fVar1 * fVar11 + fVar18 * fVar13 + fVar20 * fVar23;
          fVar18 = fVar1 * fVar12 + fVar18 * fVar14 + fVar20 * fVar22;
          fVar20 = 1.0 / SQRT(fVar21 * fVar21 + fVar17 * fVar17 + fVar18 * fVar18);
          *(ulong *)((long)paVar6 + lVar8 + -8) = CONCAT44(fVar20 * fVar18,fVar20 * fVar17);
          *(float *)((long)&paVar6->x + lVar8) = fVar21 * fVar20;
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar9 < mesh->mNumVertices);
      }
    }
  }
  return;
}

Assistant:

void PretransformVertices::ApplyTransform(aiMesh *mesh, const aiMatrix4x4 &mat) const {
	// Check whether we need to transform the coordinates at all
	if (!mat.IsIdentity()) {

		// Check for odd negative scale (mirror)
		if (mesh->HasFaces() && mat.Determinant() < 0) {
			// Reverse the mesh face winding order
			FlipWindingOrderProcess::ProcessMesh(mesh);
		}

		// Update positions
		if (mesh->HasPositions()) {
			for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
				mesh->mVertices[i] = mat * mesh->mVertices[i];
			}
		}

		// Update normals and tangents
		if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
			const aiMatrix3x3 m = aiMatrix3x3(mat).Inverse().Transpose();

			if (mesh->HasNormals()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
				}
			}
			if (mesh->HasTangentsAndBitangents()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mTangents[i] = (m * mesh->mTangents[i]).Normalize();
					mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
				}
			}
		}
	}
}